

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O2

void switch_tss_ra(CPUX86State *env,int tss_selector,uint32_t e1,uint32_t e2,int source,
                  uint32_t next_eip,uintptr_t retaddr)

{
  byte *pbVar1;
  target_ulong tVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  target_ulong tVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint eflags;
  uint32_t uVar14;
  uint32_t uVar15;
  uint uVar16;
  ulong uVar17;
  SegmentCache *pSVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  abi_ptr aVar22;
  uint local_b0;
  uint local_a8;
  uint local_98;
  uint32_t local_94;
  ulong local_90;
  ulong local_88;
  uint32_t local_7c;
  uint32_t new_segs [6];
  uint32_t new_regs [8];
  
  uVar11 = e2 >> 8 & 0xf;
  local_98 = e2;
  local_94 = e1;
  if (uVar11 == 5) {
    if (-1 < (short)e2) goto LAB_004d85c5;
    tss_selector = e1 >> 0x10;
    if ((e1 >> 0x12 & 1) == 0) {
      iVar12 = load_segment_ra(env,&local_94,&local_98,tss_selector,retaddr);
      if (((iVar12 != 0) || ((local_98 >> 0xc & 1) != 0)) || ((local_98 & 0x700) != 0x100)) {
        uVar11 = tss_selector & 0xfffffff8;
        iVar12 = 0xd;
        goto LAB_004d8605;
      }
      uVar11 = local_98 >> 8 & 0xf;
      goto LAB_004d7b0a;
    }
    uVar11 = tss_selector & 0xfffffffc;
  }
  else {
LAB_004d7b0a:
    uVar9 = local_98;
    if (-1 < (short)local_98) {
LAB_004d85c5:
      uVar11 = tss_selector & 0xfffc;
      iVar12 = 0xb;
      goto LAB_004d8605;
    }
    iVar12 = 0x67;
    if (uVar11 < 8) {
      iVar12 = 0x2b;
    }
    uVar16 = local_98 & 0xf0000 | local_94 & 0xffff;
    uVar7 = uVar16 << 0xc | 0xfff;
    if ((local_98 >> 0x17 & 1) == 0) {
      uVar7 = uVar16;
    }
    local_7c = next_eip;
    if (((tss_selector & 4U) != 0) || ((int)uVar7 < iVar12)) {
      uVar11 = tss_selector & 0xfffc;
      iVar12 = 10;
      goto LAB_004d8605;
    }
    uVar16 = local_94 >> 0x10;
    iVar12 = (local_98 & 0xff) * 0x10000;
    uVar21 = local_98 & 0xff000000;
    uVar17 = (ulong)(uVar21 + iVar12 | uVar16);
    lVar20 = 0x67;
    if (((env->tr).flags >> 0xb & 1) == 0) {
      lVar20 = 0x2b;
    }
    iVar13 = cpu_mmu_index_kernel(env);
    local_88 = uVar17;
    if (uVar11 < 8) {
      local_a8 = cpu_lduw_mmuidx_ra_x86_64(env,uVar17 + 0xe,iVar13,retaddr);
      iVar13 = cpu_mmu_index_kernel(env);
      eflags = cpu_lduw_mmuidx_ra_x86_64(env,uVar17 + 0x10,iVar13,retaddr);
      uVar17 = (ulong)(uVar16 + uVar21 + iVar12);
      for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 2) {
        iVar12 = cpu_mmu_index_kernel(env);
        uVar14 = cpu_lduw_mmuidx_ra_x86_64(env,uVar17 + 0x12 + lVar19,iVar12,retaddr);
        *(uint32_t *)((long)new_regs + lVar19 * 2) = uVar14 | 0xffff0000;
      }
      for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 4) {
        iVar12 = cpu_mmu_index_kernel(env);
        uVar14 = cpu_lduw_mmuidx_ra_x86_64(env,uVar17 + 0x22 + lVar19,iVar12,retaddr);
        *(uint32_t *)((long)new_segs + lVar19) = uVar14;
      }
      aVar22 = local_88 + 0x2a;
      iVar12 = cpu_mmu_index_kernel(env);
      local_b0 = cpu_lduw_mmuidx_ra_x86_64(env,aVar22,iVar12,retaddr);
      new_segs[4] = 0;
      new_segs[5] = 0;
      local_90 = 0;
    }
    else {
      uVar14 = cpu_ldl_mmuidx_ra_x86_64(env,uVar17 + 0x1c,iVar13,retaddr);
      local_90 = CONCAT44(local_90._4_4_,uVar14);
      iVar13 = cpu_mmu_index_kernel(env);
      local_a8 = cpu_ldl_mmuidx_ra_x86_64(env,uVar17 + 0x20,iVar13,retaddr);
      iVar13 = cpu_mmu_index_kernel(env);
      eflags = cpu_ldl_mmuidx_ra_x86_64(env,uVar17 + 0x24,iVar13,retaddr);
      uVar17 = (ulong)(uVar16 + uVar21 + iVar12);
      for (lVar19 = 0; lVar19 != 0x20; lVar19 = lVar19 + 4) {
        iVar12 = cpu_mmu_index_kernel(env);
        uVar14 = cpu_ldl_mmuidx_ra_x86_64(env,uVar17 + 0x28 + lVar19,iVar12,retaddr);
        *(uint32_t *)((long)new_regs + lVar19) = uVar14;
      }
      for (lVar19 = 0; uVar10 = local_88, lVar19 != 0x18; lVar19 = lVar19 + 4) {
        iVar12 = cpu_mmu_index_kernel(env);
        uVar14 = cpu_lduw_mmuidx_ra_x86_64(env,uVar17 + 0x48 + lVar19,iVar12,retaddr);
        *(uint32_t *)((long)new_segs + lVar19) = uVar14;
      }
      aVar22 = local_88 + 0x60;
      iVar12 = cpu_mmu_index_kernel(env);
      local_b0 = cpu_lduw_mmuidx_ra_x86_64(env,aVar22,iVar12,retaddr);
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_ldl_mmuidx_ra_x86_64(env,uVar10 + 100,iVar12,retaddr);
      local_90 = local_90 & 0xffffffff;
    }
    aVar22 = (env->tr).base;
    iVar12 = cpu_mmu_index_kernel(env);
    uVar14 = cpu_ldub_mmuidx_ra_x86_64(env,aVar22,iVar12,retaddr);
    tVar2 = (env->tr).base;
    iVar12 = cpu_mmu_index_kernel(env);
    uVar15 = cpu_ldub_mmuidx_ra_x86_64(env,tVar2 + lVar20,iVar12,retaddr);
    tVar2 = (env->tr).base;
    iVar12 = cpu_mmu_index_kernel(env);
    cpu_stb_mmuidx_ra_x86_64(env,tVar2,uVar14,iVar12,retaddr);
    tVar2 = (env->tr).base;
    iVar12 = cpu_mmu_index_kernel(env);
    cpu_stb_mmuidx_ra_x86_64(env,lVar20 + tVar2,uVar15,iVar12,retaddr);
    if ((uint)source < 2) {
      aVar22 = (env->gdt).base + (ulong)((env->tr).selector & 0xfffffff8) + 4;
      iVar12 = cpu_mmu_index_kernel(env);
      uVar14 = cpu_ldl_mmuidx_ra_x86_64(env,aVar22,iVar12,retaddr);
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stl_mmuidx_ra_x86_64(env,aVar22,uVar14 & 0xfffffdff,iVar12,retaddr);
    }
    uVar15 = cpu_compute_eflags(env);
    uVar14 = uVar15 & 0xffffbfff;
    if (source != 1) {
      uVar14 = uVar15;
    }
    tVar2 = (env->tr).base;
    iVar12 = cpu_mmu_index_kernel(env);
    if (uVar11 < 8) {
      cpu_stw_mmuidx_ra_x86_64(env,tVar2 + 0xe,local_7c,iVar12,retaddr);
      tVar2 = (env->tr).base;
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stw_mmuidx_ra_x86_64(env,tVar2 + 0x10,uVar14,iVar12,retaddr);
      tVar2 = (env->tr).base;
      tVar8 = env->regs[0];
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stw_mmuidx_ra_x86_64(env,tVar2 + 0x12,(uint32_t)tVar8,iVar12,retaddr);
      tVar2 = (env->tr).base;
      tVar8 = env->regs[1];
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stw_mmuidx_ra_x86_64(env,tVar2 + 0x14,(uint32_t)tVar8,iVar12,retaddr);
      tVar2 = (env->tr).base;
      tVar8 = env->regs[2];
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stw_mmuidx_ra_x86_64(env,tVar2 + 0x16,(uint32_t)tVar8,iVar12,retaddr);
      tVar2 = (env->tr).base;
      tVar8 = env->regs[3];
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stw_mmuidx_ra_x86_64(env,tVar2 + 0x18,(uint32_t)tVar8,iVar12,retaddr);
      tVar2 = (env->tr).base;
      tVar8 = env->regs[4];
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stw_mmuidx_ra_x86_64(env,tVar2 + 0x1a,(uint32_t)tVar8,iVar12,retaddr);
      tVar2 = (env->tr).base;
      tVar8 = env->regs[5];
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stw_mmuidx_ra_x86_64(env,tVar2 + 0x1c,(uint32_t)tVar8,iVar12,retaddr);
      tVar2 = (env->tr).base;
      tVar8 = env->regs[6];
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stw_mmuidx_ra_x86_64(env,tVar2 + 0x1e,(uint32_t)tVar8,iVar12,retaddr);
      tVar2 = (env->tr).base;
      tVar8 = env->regs[7];
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stw_mmuidx_ra_x86_64(env,tVar2 + 0x20,(uint32_t)tVar8,iVar12,retaddr);
      pSVar18 = env->segs;
      for (lVar20 = 0x22; lVar20 != 0x32; lVar20 = lVar20 + 4) {
        tVar2 = (env->tr).base;
        uVar14 = pSVar18->selector;
        iVar12 = cpu_mmu_index_kernel(env);
        cpu_stw_mmuidx_ra_x86_64(env,tVar2 + lVar20,uVar14,iVar12,retaddr);
        pSVar18 = pSVar18 + 1;
      }
    }
    else {
      cpu_stl_mmuidx_ra_x86_64(env,tVar2 + 0x20,local_7c,iVar12,retaddr);
      tVar2 = (env->tr).base;
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stl_mmuidx_ra_x86_64(env,tVar2 + 0x24,uVar14,iVar12,retaddr);
      tVar2 = (env->tr).base;
      tVar8 = env->regs[0];
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stl_mmuidx_ra_x86_64(env,tVar2 + 0x28,(uint32_t)tVar8,iVar12,retaddr);
      tVar2 = (env->tr).base;
      tVar8 = env->regs[1];
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stl_mmuidx_ra_x86_64(env,tVar2 + 0x2c,(uint32_t)tVar8,iVar12,retaddr);
      tVar2 = (env->tr).base;
      tVar8 = env->regs[2];
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stl_mmuidx_ra_x86_64(env,tVar2 + 0x30,(uint32_t)tVar8,iVar12,retaddr);
      tVar2 = (env->tr).base;
      tVar8 = env->regs[3];
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stl_mmuidx_ra_x86_64(env,tVar2 + 0x34,(uint32_t)tVar8,iVar12,retaddr);
      tVar2 = (env->tr).base;
      tVar8 = env->regs[4];
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stl_mmuidx_ra_x86_64(env,tVar2 + 0x38,(uint32_t)tVar8,iVar12,retaddr);
      tVar2 = (env->tr).base;
      tVar8 = env->regs[5];
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stl_mmuidx_ra_x86_64(env,tVar2 + 0x3c,(uint32_t)tVar8,iVar12,retaddr);
      tVar2 = (env->tr).base;
      tVar8 = env->regs[6];
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stl_mmuidx_ra_x86_64(env,tVar2 + 0x40,(uint32_t)tVar8,iVar12,retaddr);
      tVar2 = (env->tr).base;
      tVar8 = env->regs[7];
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stl_mmuidx_ra_x86_64(env,tVar2 + 0x44,(uint32_t)tVar8,iVar12,retaddr);
      pSVar18 = env->segs;
      for (lVar20 = 0x48; lVar20 != 0x60; lVar20 = lVar20 + 4) {
        tVar2 = (env->tr).base;
        uVar14 = pSVar18->selector;
        iVar12 = cpu_mmu_index_kernel(env);
        cpu_stw_mmuidx_ra_x86_64(env,tVar2 + lVar20,uVar14,iVar12,retaddr);
        pSVar18 = pSVar18 + 1;
      }
    }
    if (source == 0) {
LAB_004d82b2:
      aVar22 = (long)(int)(tss_selector & 0xfffffff8U | 4) + (env->gdt).base;
      iVar12 = cpu_mmu_index_kernel(env);
      uVar14 = cpu_ldl_mmuidx_ra_x86_64(env,aVar22,iVar12,retaddr);
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stl_mmuidx_ra_x86_64(env,aVar22,uVar14 | 0x200,iVar12,retaddr);
    }
    else if (source == 2) {
      uVar14 = (env->tr).selector;
      iVar12 = cpu_mmu_index_kernel(env);
      cpu_stw_mmuidx_ra_x86_64(env,local_88,uVar14,iVar12,retaddr);
      eflags = eflags | 0x4000;
      goto LAB_004d82b2;
    }
    uVar17 = env->cr[0];
    env->cr[0] = uVar17 | 8;
    pbVar1 = (byte *)((long)&env->hflags + 1);
    *pbVar1 = *pbVar1 | 8;
    (env->tr).selector = tss_selector;
    (env->tr).base = local_88;
    (env->tr).limit = uVar7;
    (env->tr).flags = uVar9 & 0xfffffdff;
    if ((int)uVar17 < 0 && 7 < uVar11) {
      cpu_x86_update_cr3_x86_64(env,local_90);
    }
    env->eip = (ulong)local_a8;
    iVar12 = 0x277300;
    if (uVar11 < 8) {
      iVar12 = 0x7300;
    }
    cpu_load_eflags(env,eflags,iVar12);
    auVar3._8_4_ = SUB84(new_regs._0_8_,4);
    auVar3._0_8_ = new_regs._0_8_ & 0xffffffff;
    auVar3._12_4_ = 0;
    *(undefined1 (*) [16])env->regs = auVar3;
    auVar4._8_4_ = SUB84(new_regs._8_8_,4);
    auVar4._0_8_ = new_regs._8_8_ & 0xffffffff;
    auVar4._12_4_ = 0;
    *(undefined1 (*) [16])(env->regs + 2) = auVar4;
    auVar5._8_4_ = SUB84(new_regs._16_8_,4);
    auVar5._0_8_ = new_regs._16_8_ & 0xffffffff;
    auVar5._12_4_ = 0;
    *(undefined1 (*) [16])(env->regs + 4) = auVar5;
    auVar6._8_4_ = SUB84(new_regs._24_8_,4);
    auVar6._0_8_ = new_regs._24_8_ & 0xffffffff;
    auVar6._12_4_ = 0;
    *(undefined1 (*) [16])(env->regs + 6) = auVar6;
    lVar20 = 0;
    if ((eflags >> 0x11 & 1) == 0) {
      for (; lVar20 != 6; lVar20 = lVar20 + 1) {
        cpu_x86_load_seg_cache(env,(int)lVar20,new_segs[lVar20],0,0,0);
      }
    }
    else {
      for (; lVar20 != 6; lVar20 = lVar20 + 1) {
        load_seg_vm(env,(int)lVar20,new_segs[lVar20]);
      }
    }
    (env->ldt).selector = local_b0 & 0xfffffffb;
    (env->ldt).base = 0;
    (env->ldt).limit = 0;
    (env->ldt).flags = 0;
    if ((local_b0 & 4) == 0) {
      uVar11 = local_b0 & 0xfff8;
      if (uVar11 == 0) {
LAB_004d84ef:
        if ((eflags >> 0x11 & 1) == 0) {
          uVar11 = new_segs[1] & 3;
          tss_load_seg(env,1,new_segs[1],uVar11,retaddr);
          tss_load_seg(env,2,new_segs[2],uVar11,retaddr);
          tss_load_seg(env,0,new_segs[0],uVar11,retaddr);
          tss_load_seg(env,3,new_segs[3],uVar11,retaddr);
          tss_load_seg(env,4,new_segs[4],uVar11,retaddr);
          tss_load_seg(env,5,new_segs[5],uVar11,retaddr);
        }
        if (local_a8 <= env->segs[1].limit) {
          if ((env->dr[7] & 0x55) == 0) {
            return;
          }
          cpu_x86_update_dr7_x86_64(env,(uint)env->dr[7] & 0xffffffaa);
          return;
        }
        iVar12 = 0xd;
        uVar11 = 0;
      }
      else {
        if ((local_b0 | 7) <= (env->gdt).limit) {
          tVar2 = (env->gdt).base;
          iVar12 = cpu_mmu_index_kernel(env);
          uVar14 = cpu_ldl_mmuidx_ra_x86_64
                             (env,tVar2 + (long)(int)(local_b0 & 0xfffffff8),iVar12,retaddr);
          iVar12 = cpu_mmu_index_kernel(env);
          uVar15 = cpu_ldl_mmuidx_ra_x86_64
                             (env,(long)(int)(local_b0 & 0xfffffff8) + 4 + tVar2,iVar12,retaddr);
          if (((uVar15 & 0x1f00) == 0x200) && ((short)uVar15 < 0)) {
            load_seg_cache_raw_dt(&env->ldt,uVar14,uVar15);
            goto LAB_004d84ef;
          }
        }
        iVar12 = 10;
      }
      goto LAB_004d8605;
    }
    uVar11 = local_b0 & 0xfffc;
  }
  iVar12 = 10;
LAB_004d8605:
  raise_exception_err_ra_x86_64(env,iVar12,uVar11,retaddr);
}

Assistant:

static void switch_tss_ra(CPUX86State *env, int tss_selector,
                          uint32_t e1, uint32_t e2, int source,
                          uint32_t next_eip, uintptr_t retaddr)
{
    int tss_limit, tss_limit_max, type, old_tss_limit_max, old_type, v1, v2, i;
    target_ulong tss_base;
    uint32_t new_regs[8], new_segs[6];
    uint32_t new_eflags, new_eip, new_cr3, new_ldt, new_trap;
    uint32_t old_eflags, eflags_mask;
    SegmentCache *dt;
    int index;
    target_ulong ptr;

    type = (e2 >> DESC_TYPE_SHIFT) & 0xf;
    LOG_PCALL("switch_tss: sel=0x%04x type=%d src=%d\n", tss_selector, type,
              source);

    /* if task gate, we read the TSS segment and we load it */
    if (type == 5) {
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0B_NOSEG, tss_selector & 0xfffc, retaddr);
        }
        tss_selector = e1 >> 16;
        if (tss_selector & 4) {
            raise_exception_err_ra(env, EXCP0A_TSS, tss_selector & 0xfffc, retaddr);
        }
        if (load_segment_ra(env, &e1, &e2, tss_selector, retaddr) != 0) {
            raise_exception_err_ra(env, EXCP0D_GPF, tss_selector & 0xfffc, retaddr);
        }
        if (e2 & DESC_S_MASK) {
            raise_exception_err_ra(env, EXCP0D_GPF, tss_selector & 0xfffc, retaddr);
        }
        type = (e2 >> DESC_TYPE_SHIFT) & 0xf;
        if ((type & 7) != 1) {
            raise_exception_err_ra(env, EXCP0D_GPF, tss_selector & 0xfffc, retaddr);
        }
    }

    if (!(e2 & DESC_P_MASK)) {
        raise_exception_err_ra(env, EXCP0B_NOSEG, tss_selector & 0xfffc, retaddr);
    }

    if (type & 8) {
        tss_limit_max = 103;
    } else {
        tss_limit_max = 43;
    }
    tss_limit = get_seg_limit(e1, e2);
    tss_base = get_seg_base(e1, e2);
    if ((tss_selector & 4) != 0 ||
        tss_limit < tss_limit_max) {
        raise_exception_err_ra(env, EXCP0A_TSS, tss_selector & 0xfffc, retaddr);
    }
    old_type = (env->tr.flags >> DESC_TYPE_SHIFT) & 0xf;
    if (old_type & 8) {
        old_tss_limit_max = 103;
    } else {
        old_tss_limit_max = 43;
    }

    /* read all the registers from the new TSS */
    if (type & 8) {
        /* 32 bit */
        new_cr3 = cpu_ldl_kernel_ra(env, tss_base + 0x1c, retaddr);
        new_eip = cpu_ldl_kernel_ra(env, tss_base + 0x20, retaddr);
        new_eflags = cpu_ldl_kernel_ra(env, tss_base + 0x24, retaddr);
        for (i = 0; i < 8; i++) {
            new_regs[i] = cpu_ldl_kernel_ra(env, tss_base + (0x28 + i * 4),
                                            retaddr);
        }
        for (i = 0; i < 6; i++) {
            new_segs[i] = cpu_lduw_kernel_ra(env, tss_base + (0x48 + i * 4),
                                             retaddr);
        }
        new_ldt = cpu_lduw_kernel_ra(env, tss_base + 0x60, retaddr);
        new_trap = cpu_ldl_kernel_ra(env, tss_base + 0x64, retaddr);
    } else {
        /* 16 bit */
        new_cr3 = 0;
        new_eip = cpu_lduw_kernel_ra(env, tss_base + 0x0e, retaddr);
        new_eflags = cpu_lduw_kernel_ra(env, tss_base + 0x10, retaddr);
        for (i = 0; i < 8; i++) {
            new_regs[i] = cpu_lduw_kernel_ra(env, tss_base + (0x12 + i * 2),
                                             retaddr) | 0xffff0000;
        }
        for (i = 0; i < 4; i++) {
            new_segs[i] = cpu_lduw_kernel_ra(env, tss_base + (0x22 + i * 4),
                                             retaddr);
        }
        new_ldt = cpu_lduw_kernel_ra(env, tss_base + 0x2a, retaddr);
        new_segs[R_FS] = 0;
        new_segs[R_GS] = 0;
        new_trap = 0;
    }
    /* XXX: avoid a compiler warning, see
     http://support.amd.com/us/Processor_TechDocs/24593.pdf
     chapters 12.2.5 and 13.2.4 on how to implement TSS Trap bit */
    (void)new_trap;

    /* NOTE: we must avoid memory exceptions during the task switch,
       so we make dummy accesses before */
    /* XXX: it can still fail in some cases, so a bigger hack is
       necessary to valid the TLB after having done the accesses */

    v1 = cpu_ldub_kernel_ra(env, env->tr.base, retaddr);
    v2 = cpu_ldub_kernel_ra(env, env->tr.base + old_tss_limit_max, retaddr);
    cpu_stb_kernel_ra(env, env->tr.base, v1, retaddr);
    cpu_stb_kernel_ra(env, env->tr.base + old_tss_limit_max, v2, retaddr);

    /* clear busy bit (it is restartable) */
    if (source == SWITCH_TSS_JMP || source == SWITCH_TSS_IRET) {
        target_ulong ptr;
        uint32_t e2;

        ptr = env->gdt.base + (env->tr.selector & ~7);
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, retaddr);
        e2 &= ~DESC_TSS_BUSY_MASK;
        cpu_stl_kernel_ra(env, ptr + 4, e2, retaddr);
    }
    old_eflags = cpu_compute_eflags(env);
    if (source == SWITCH_TSS_IRET) {
        old_eflags &= ~NT_MASK;
    }

    /* save the current state in the old TSS */
    if (type & 8) {
        /* 32 bit */
        cpu_stl_kernel_ra(env, env->tr.base + 0x20, next_eip, retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + 0x24, old_eflags, retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 0 * 4), env->regs[R_EAX], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 1 * 4), env->regs[R_ECX], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 2 * 4), env->regs[R_EDX], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 3 * 4), env->regs[R_EBX], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 4 * 4), env->regs[R_ESP], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 5 * 4), env->regs[R_EBP], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 6 * 4), env->regs[R_ESI], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 7 * 4), env->regs[R_EDI], retaddr);
        for (i = 0; i < 6; i++) {
            cpu_stw_kernel_ra(env, env->tr.base + (0x48 + i * 4),
                              env->segs[i].selector, retaddr);
        }
    } else {
        /* 16 bit */
        cpu_stw_kernel_ra(env, env->tr.base + 0x0e, next_eip, retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + 0x10, old_eflags, retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 0 * 2), env->regs[R_EAX], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 1 * 2), env->regs[R_ECX], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 2 * 2), env->regs[R_EDX], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 3 * 2), env->regs[R_EBX], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 4 * 2), env->regs[R_ESP], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 5 * 2), env->regs[R_EBP], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 6 * 2), env->regs[R_ESI], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 7 * 2), env->regs[R_EDI], retaddr);
        for (i = 0; i < 4; i++) {
            cpu_stw_kernel_ra(env, env->tr.base + (0x22 + i * 4),
                              env->segs[i].selector, retaddr);
        }
    }

    /* now if an exception occurs, it will occurs in the next task
       context */

    if (source == SWITCH_TSS_CALL) {
        cpu_stw_kernel_ra(env, tss_base, env->tr.selector, retaddr);
        new_eflags |= NT_MASK;
    }

    /* set busy bit */
    if (source == SWITCH_TSS_JMP || source == SWITCH_TSS_CALL) {
        target_ulong ptr;
        uint32_t e2;

        ptr = env->gdt.base + (tss_selector & ~7);
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, retaddr);
        e2 |= DESC_TSS_BUSY_MASK;
        cpu_stl_kernel_ra(env, ptr + 4, e2, retaddr);
    }

    /* set the new CPU state */
    /* from this point, any exception which occurs can give problems */
    env->cr[0] |= CR0_TS_MASK;
    env->hflags |= HF_TS_MASK;
    env->tr.selector = tss_selector;
    env->tr.base = tss_base;
    env->tr.limit = tss_limit;
    env->tr.flags = e2 & ~DESC_TSS_BUSY_MASK;

    if ((type & 8) && (env->cr[0] & CR0_PG_MASK)) {
        cpu_x86_update_cr3(env, new_cr3);
    }

    /* load all registers without an exception, then reload them with
       possible exception */
    env->eip = new_eip;
    eflags_mask = TF_MASK | AC_MASK | ID_MASK |
        IF_MASK | IOPL_MASK | VM_MASK | RF_MASK | NT_MASK;
    if (!(type & 8)) {
        eflags_mask &= 0xffff;
    }
    cpu_load_eflags(env, new_eflags, eflags_mask);
    /* XXX: what to do in 16 bit case? */
    env->regs[R_EAX] = new_regs[0];
    env->regs[R_ECX] = new_regs[1];
    env->regs[R_EDX] = new_regs[2];
    env->regs[R_EBX] = new_regs[3];
    env->regs[R_ESP] = new_regs[4];
    env->regs[R_EBP] = new_regs[5];
    env->regs[R_ESI] = new_regs[6];
    env->regs[R_EDI] = new_regs[7];
    if (new_eflags & VM_MASK) {
        for (i = 0; i < 6; i++) {
            load_seg_vm(env, i, new_segs[i]);
        }
    } else {
        /* first just selectors as the rest may trigger exceptions */
        for (i = 0; i < 6; i++) {
            cpu_x86_load_seg_cache(env, i, new_segs[i], 0, 0, 0);
        }
    }

    env->ldt.selector = new_ldt & ~4;
    env->ldt.base = 0;
    env->ldt.limit = 0;
    env->ldt.flags = 0;

    /* load the LDT */
    if (new_ldt & 4) {
        raise_exception_err_ra(env, EXCP0A_TSS, new_ldt & 0xfffc, retaddr);
    }

    if ((new_ldt & 0xfffc) != 0) {
        dt = &env->gdt;
        index = new_ldt & ~7;
        if ((index + 7) > dt->limit) {
            raise_exception_err_ra(env, EXCP0A_TSS, new_ldt & 0xfffc, retaddr);
        }
        ptr = dt->base + index;
        e1 = cpu_ldl_kernel_ra(env, ptr, retaddr);
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, retaddr);
        if ((e2 & DESC_S_MASK) || ((e2 >> DESC_TYPE_SHIFT) & 0xf) != 2) {
            raise_exception_err_ra(env, EXCP0A_TSS, new_ldt & 0xfffc, retaddr);
        }
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0A_TSS, new_ldt & 0xfffc, retaddr);
        }
        load_seg_cache_raw_dt(&env->ldt, e1, e2);
    }

    /* load the segments */
    if (!(new_eflags & VM_MASK)) {
        int cpl = new_segs[R_CS] & 3;
        tss_load_seg(env, R_CS, new_segs[R_CS], cpl, retaddr);
        tss_load_seg(env, R_SS, new_segs[R_SS], cpl, retaddr);
        tss_load_seg(env, R_ES, new_segs[R_ES], cpl, retaddr);
        tss_load_seg(env, R_DS, new_segs[R_DS], cpl, retaddr);
        tss_load_seg(env, R_FS, new_segs[R_FS], cpl, retaddr);
        tss_load_seg(env, R_GS, new_segs[R_GS], cpl, retaddr);
    }

    /* check that env->eip is in the CS segment limits */
    if (new_eip > env->segs[R_CS].limit) {
        /* XXX: different exception if CALL? */
        raise_exception_err_ra(env, EXCP0D_GPF, 0, retaddr);
    }

    /* reset local breakpoints */
    if (env->dr[7] & DR7_LOCAL_BP_MASK) {
        cpu_x86_update_dr7(env, env->dr[7] & ~DR7_LOCAL_BP_MASK);
    }
}